

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

bool __thiscall Json::Value::isInt(Value *this)

{
  char cVar1;
  bool bVar2;
  double dVar3;
  double integral_part;
  double dStack_8;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x03') {
    dVar3 = (this->value_).real_;
    bVar2 = false;
    if ((-2147483648.0 <= dVar3) && (dVar3 <= 2147483647.0)) {
      dStack_8 = 0.0;
      dVar3 = modf(dVar3,&dStack_8);
      return (bool)(-(dVar3 == 0.0) & 1);
    }
  }
  else if (cVar1 == '\x02') {
    bVar2 = (this->value_).uint_ >> 0x1f == 0;
  }
  else {
    if (cVar1 != '\x01') {
      return false;
    }
    bVar2 = (long)(int)(this->value_).int_ == (this->value_).int_;
  }
  return bVar2;
}

Assistant:

bool Value::isInt() const {
  switch (type_) {
  case intValue:
    return value_.int_ >= minInt && value_.int_ <= maxInt;
  case uintValue:
    return value_.uint_ <= UInt(maxInt);
  case realValue:
    return value_.real_ >= minInt && value_.real_ <= maxInt &&
           IsIntegral(value_.real_);
  default:
    break;
  }
  return false;
}